

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primrefgen_presplit.h
# Opt level: O3

PrimInfo * __thiscall
embree::avx::createPrimRefArray_presplit<embree::QuadMesh,embree::avx::QuadSplitterFactory>
          (PrimInfo *__return_storage_ptr__,avx *this,Scene *scene,GTypeMask types,bool mblur,
          size_t numPrimRefs,mvector<PrimRef> *prims,BuildProgressMonitor *progressMonitor)

{
  PrimInfo *pPVar1;
  char cVar2;
  int iVar3;
  ulong uVar4;
  intrusive_list_node *piVar5;
  runtime_error *prVar6;
  ulong uVar7;
  ulong uVar8;
  intrusive_list_node *piVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  undefined1 *puVar13;
  undefined7 in_register_00000081;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  undefined1 *puVar18;
  size_t taskCount_1;
  size_t taskCount;
  Iterator2 iter;
  anon_class_8_1_a89d07ac primitiveArea;
  anon_class_8_1_78f12065 split_primitive;
  TriangleSplitterFactory Splitter;
  ParallelForForPrefixSumState<embree::PrimInfoT<embree::BBox<embree::Vec3fa>_>_> pstate;
  anon_class_8_1_a89d07ac *in_stack_ffffffffffffd1e8;
  undefined1 *local_2e08;
  ParallelForForPrefixSumState<embree::PrimInfoT<embree::BBox<embree::Vec3fa>_>_> *local_2e00;
  avx *local_2df8;
  undefined1 *local_2df0;
  undefined1 *local_2de8;
  PrimInfo *local_2de0;
  ParallelForForPrefixSumState<embree::PrimInfoT<embree::BBox<embree::Vec3fa>_>_> *local_2dd8;
  avx *local_2dd0;
  undefined1 local_2dc8 [24];
  undefined1 *puStack_2db0;
  intrusive_list_node local_2da8;
  intrusive_list_node local_2d98;
  intrusive_list_node local_2d88;
  anon_class_8_1_898bcfc2_conflict5 local_2d70;
  undefined1 *local_2d68;
  avx *local_2d60;
  Scene *local_2d58;
  char local_2d50;
  MemoryMonitorInterface *local_2d48;
  undefined1 *local_2d40;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_2d38;
  undefined1 *local_2d30;
  undefined1 *local_2d28;
  anon_class_8_1_898bcfc2_conflict5 *local_2d20;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_2d18;
  undefined4 local_2d08;
  undefined4 uStack_2d04;
  undefined4 uStack_2d00;
  undefined4 uStack_2cfc;
  undefined4 local_2cf8;
  undefined4 uStack_2cf4;
  undefined4 uStack_2cf0;
  undefined4 uStack_2cec;
  undefined4 local_2ce8;
  undefined4 uStack_2ce4;
  undefined4 uStack_2ce0;
  undefined4 uStack_2cdc;
  intrusive_list_node local_2cd8;
  task_group_context local_2cc8;
  MemoryMonitorInterface local_2c48;
  long local_2c40 [63];
  ulong local_2a48 [64];
  undefined1 *local_2848;
  ulong local_2840;
  intrusive_list_node local_13f8 [316];
  
  local_2df8 = (avx *)CONCAT71(in_register_00000081,mblur);
  cVar2 = (char)types;
  local_2848 = (undefined1 *)0x0;
  uVar11 = 0;
  local_2de0 = __return_storage_ptr__;
  local_2dd0 = this;
  local_2d60 = this;
  local_2d58 = scene;
  local_2d50 = cVar2;
  (*(code *)((prims->alloc).device)->_vptr_MemoryMonitorInterface)();
  if (*(long *)(this + 0x1d8) != 0) {
    uVar11 = 0;
    lVar12 = 0;
    do {
      lVar14 = *(long *)(*(long *)(this + 0x1e8) + lVar12 * 8);
      if ((((lVar14 == 0) || ((*(uint *)(lVar14 + 0x3c) >> 0x15 & 1) == 0)) ||
          (((long)(1 << ((byte)*(uint *)(lVar14 + 0x3c) & 0x1f)) & (ulong)scene) == 0)) ||
         ((*(int *)(lVar14 + 0x24) == 1) == (bool)cVar2)) {
        uVar7 = 0;
      }
      else {
        uVar7 = (ulong)*(uint *)(lVar14 + 0x20);
      }
      uVar11 = uVar11 + uVar7;
      lVar12 = lVar12 + 1;
    } while (*(long *)(this + 0x1d8) != lVar12);
  }
  local_2840 = uVar11;
  iVar3 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
  uVar7 = uVar11 + 0x3ff >> 10;
  if ((ulong)(long)iVar3 < uVar7) {
    uVar7 = (long)iVar3;
  }
  uVar16 = 0x40;
  if (uVar7 < 0x40) {
    uVar16 = uVar7;
  }
  puVar18 = (undefined1 *)(uVar16 + (uVar16 == 0));
  local_2c48._vptr_MemoryMonitorInterface = (_func_int **)0x0;
  local_2a48[0] = 0;
  local_2848 = puVar18;
  if (1 < uVar7) {
    uVar16 = 0;
    uVar7 = uVar11 / (ulong)puVar18;
    lVar12 = *(long *)(this + 0x1e8);
    puVar13 = (undefined1 *)0x1;
    lVar14 = 0;
    do {
      lVar10 = *(long *)(lVar12 + lVar14 * 8);
      if (((lVar10 == 0) || ((*(uint *)(lVar10 + 0x3c) >> 0x15 & 1) == 0)) ||
         ((((long)(1 << ((byte)*(uint *)(lVar10 + 0x3c) & 0x1f)) & (ulong)scene) == 0 ||
          (((*(int *)(lVar10 + 0x24) == 1) == (bool)cVar2 ||
           (uVar15 = (ulong)*(uint *)(lVar10 + 0x20), uVar15 == 0)))))) {
        uVar15 = 0;
        lVar10 = 0;
      }
      else {
        uVar8 = (long)(puVar13 + 1) * uVar11;
        lVar10 = 0;
        uVar17 = 0;
        do {
          uVar4 = uVar7;
          uVar7 = uVar4;
          if ((uVar16 + uVar15 + lVar10 < uVar4) || (puVar18 <= puVar13)) break;
          local_2c40[(long)puVar13 + 0xffffffffffffffff] = lVar14;
          uVar17 = uVar17 + (uVar4 - uVar16);
          local_2a48[(long)puVar13] = uVar17;
          puVar13 = puVar13 + 1;
          uVar7 = uVar8 / (ulong)local_2848;
          lVar10 = -uVar17;
          uVar8 = uVar8 + uVar11;
          uVar16 = uVar4;
          puVar18 = local_2848;
        } while (uVar17 < uVar15);
      }
      uVar16 = uVar15 + uVar16 + lVar10;
      lVar14 = lVar14 + 1;
    } while (puVar13 < puVar18);
  }
  local_2d18.m128[0] = INFINITY;
  local_2d18.m128[1] = INFINITY;
  local_2d18.m128[2] = INFINITY;
  local_2d18.m128[3] = INFINITY;
  local_2d08 = 0xff800000;
  uStack_2d04 = 0xff800000;
  uStack_2d00 = 0xff800000;
  uStack_2cfc = 0xff800000;
  local_2cf8 = 0x7f800000;
  uStack_2cf4 = 0x7f800000;
  uStack_2cf0 = 0x7f800000;
  uStack_2cec = 0x7f800000;
  local_2ce8 = 0xff800000;
  uStack_2ce4 = 0xff800000;
  uStack_2ce0 = 0xff800000;
  uStack_2cdc = 0xff800000;
  local_2cd8 = (intrusive_list_node)(ZEXT816(0) << 0x20);
  local_2d48 = (MemoryMonitorInterface *)&local_2df0;
  local_2dc8._8_8_ = &local_2de8;
  local_2dc8._0_8_ = &local_2c48;
  puStack_2db0 = (undefined1 *)&local_2e08;
  local_2dc8._16_8_ = &local_2d18;
  local_2da8.my_next_node = (intrusive_list_node *)&local_2d48;
  local_2da8.my_prev_node = (intrusive_list_node *)&stack0xffffffffffffd1ee;
  local_2cc8.my_version = proxy_support;
  local_2cc8.my_traits = (context_traits)0x4;
  local_2cc8.my_name = CUSTOM_CTX;
  local_2e08 = (undefined1 *)&local_2d60;
  local_2e00 = (ParallelForForPrefixSumState<embree::PrimInfoT<embree::BBox<embree::Vec3fa>_>_> *)
               numPrimRefs;
  local_2df0 = (undefined1 *)numPrimRefs;
  local_2de8 = puVar18;
  local_2d40 = (undefined1 *)&local_2d60;
  local_2cc8.my_node = local_2cd8;
  tbb::detail::r1::initialize(&local_2cc8);
  local_2d70.func = (anon_class_48_6_afa08d2e *)local_2dc8;
  tbb::detail::d1::
  parallel_for_impl<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_for_h:32:43),_const_tbb::detail::d1::auto_partitioner>
            (0,(unsigned_long)puVar18,1,&local_2d70,(auto_partitioner *)&local_2dd8,&local_2cc8);
  cVar2 = tbb::detail::r1::is_group_execution_cancelled(&local_2cc8);
  if (cVar2 != '\0') {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar6,"task cancelled");
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tbb::detail::r1::destroy(&local_2cc8);
  local_2dc8._4_4_ = local_2d18.m128[1];
  local_2dc8._0_4_ = local_2d18.m128[0];
  local_2dc8._8_4_ = local_2d18.m128[2];
  local_2dc8._12_4_ = local_2d18.m128[3];
  local_2dc8._20_4_ = uStack_2d04;
  local_2dc8._16_4_ = local_2d08;
  unique0x10000578 = uStack_2d00;
  unique0x1000057c = uStack_2cfc;
  local_2da8.my_prev_node._4_4_ = uStack_2cf4;
  local_2da8.my_prev_node._0_4_ = local_2cf8;
  local_2da8.my_next_node._0_4_ = uStack_2cf0;
  local_2da8.my_next_node._4_4_ = uStack_2cec;
  local_2d98.my_prev_node._4_4_ = uStack_2ce4;
  local_2d98.my_prev_node._0_4_ = local_2ce8;
  local_2d98.my_next_node._0_4_ = uStack_2ce0;
  local_2d98.my_next_node._4_4_ = uStack_2cdc;
  local_2d88 = local_2cd8;
  piVar5 = local_2cd8.my_next_node;
  piVar9 = local_2cd8.my_prev_node;
  if (local_2de8 != (undefined1 *)0x0) {
    piVar5 = local_13f8;
    puVar18 = local_2de8;
    do {
      *(undefined1 (*) [16])(piVar5 + -4) = local_2dc8._0_16_;
      piVar5[-3] = unique0x10000318;
      piVar5[-2] = local_2da8;
      piVar5[-1] = local_2d98;
      piVar5->my_prev_node = local_2d88.my_prev_node;
      piVar5->my_next_node = local_2d88.my_next_node;
      local_2dc8._0_16_ = vminps_avx(local_2dc8._0_16_,(undefined1  [16])piVar5[-0x144]);
      unique0x000f2b00 =
           (intrusive_list_node)
           vmaxps_avx((undefined1  [16])unique0x10000318,(undefined1  [16])piVar5[-0x143]);
      local_2da8 = (intrusive_list_node)
                   vminps_avx((undefined1  [16])local_2da8,(undefined1  [16])piVar5[-0x142]);
      local_2d98 = (intrusive_list_node)
                   vmaxps_avx((undefined1  [16])local_2d98,(undefined1  [16])piVar5[-0x141]);
      local_2d88 = (intrusive_list_node)
                   vpaddq_avx((undefined1  [16])local_2d88,(undefined1  [16])piVar5[-0x140]);
      piVar5 = piVar5 + 5;
      puVar18 = (undefined1 *)((long)puVar18 + 0xffffffffffffffff);
    } while (puVar18 != (undefined1 *)0x0);
    piVar5 = (intrusive_list_node *)vpextrq_avx((undefined1  [16])local_2d88,1);
    piVar9 = local_2d88.my_prev_node;
  }
  if ((avx *)((long)piVar5 - (long)piVar9) != local_2df8) {
    (*(code *)((prims->alloc).device)->_vptr_MemoryMonitorInterface)(prims,0);
    puVar18 = local_2848;
    local_2d18.m128[0] = INFINITY;
    local_2d18.m128[1] = INFINITY;
    local_2d18.m128[2] = INFINITY;
    local_2d18.m128[3] = INFINITY;
    local_2d08 = 0xff800000;
    uStack_2d04 = 0xff800000;
    uStack_2d00 = 0xff800000;
    uStack_2cfc = 0xff800000;
    local_2cf8 = 0x7f800000;
    uStack_2cf4 = 0x7f800000;
    uStack_2cf0 = 0x7f800000;
    uStack_2cec = 0x7f800000;
    local_2ce8 = 0xff800000;
    uStack_2ce4 = 0xff800000;
    uStack_2ce0 = 0xff800000;
    uStack_2cdc = 0xff800000;
    local_2cd8 = (intrusive_list_node)(ZEXT816(0) << 0x20);
    local_2dd8 = local_2e00;
    local_2e08 = local_2848;
    local_2d48 = &local_2c48;
    local_2d40 = (undefined1 *)&local_2e08;
    local_2d30 = (undefined1 *)&local_2df0;
    local_2d28 = &stack0xffffffffffffd1ef;
    local_2cc8.my_version = proxy_support;
    local_2cc8.my_traits = (context_traits)0x4;
    local_2cc8.my_name = CUSTOM_CTX;
    local_2df0 = (undefined1 *)&local_2d60;
    local_2d70.func = (anon_class_48_6_afa08d2e *)&local_2dd8;
    local_2d68 = (undefined1 *)&local_2d60;
    local_2d38 = &local_2d18;
    local_2d20 = &local_2d70;
    local_2cc8.my_node = local_2cd8;
    tbb::detail::r1::initialize(&local_2cc8);
    local_2de8 = (undefined1 *)&local_2d48;
    tbb::detail::d1::
    parallel_for_impl<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_for_h:32:43),_const_tbb::detail::d1::auto_partitioner>
              (0,(unsigned_long)puVar18,1,(anon_class_8_1_898bcfc2_conflict5 *)&local_2de8,
               (auto_partitioner *)&stack0xffffffffffffd1ee,&local_2cc8);
    cVar2 = tbb::detail::r1::is_group_execution_cancelled(&local_2cc8);
    if (cVar2 != '\0') {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar6,"task cancelled");
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy(&local_2cc8);
    local_2dc8._4_4_ = local_2d18.m128[1];
    local_2dc8._0_4_ = local_2d18.m128[0];
    local_2dc8._8_4_ = local_2d18.m128[2];
    local_2dc8._12_4_ = local_2d18.m128[3];
    local_2dc8._20_4_ = uStack_2d04;
    local_2dc8._16_4_ = local_2d08;
    unique0x1000059c = uStack_2d00;
    unique0x100005a0 = uStack_2cfc;
    local_2da8.my_prev_node._4_4_ = uStack_2cf4;
    local_2da8.my_prev_node._0_4_ = local_2cf8;
    local_2da8.my_next_node._0_4_ = uStack_2cf0;
    local_2da8.my_next_node._4_4_ = uStack_2cec;
    local_2d98.my_prev_node._4_4_ = uStack_2ce4;
    local_2d98.my_prev_node._0_4_ = local_2ce8;
    local_2d98.my_next_node._0_4_ = uStack_2ce0;
    local_2d98.my_next_node._4_4_ = uStack_2cdc;
    local_2d88 = local_2cd8;
    if (local_2e08 != (undefined1 *)0x0) {
      piVar5 = local_13f8;
      puVar18 = local_2e08;
      do {
        *(undefined1 (*) [16])(piVar5 + -4) = local_2dc8._0_16_;
        piVar5[-3] = unique0x10000360;
        piVar5[-2] = local_2da8;
        piVar5[-1] = local_2d98;
        *piVar5 = local_2d88;
        local_2dc8._0_16_ = vminps_avx(local_2dc8._0_16_,(undefined1  [16])piVar5[-0x144]);
        unique0x000f2b00 =
             (intrusive_list_node)
             vmaxps_avx((undefined1  [16])unique0x10000360,(undefined1  [16])piVar5[-0x143]);
        local_2da8 = (intrusive_list_node)
                     vminps_avx((undefined1  [16])local_2da8,(undefined1  [16])piVar5[-0x142]);
        local_2d98 = (intrusive_list_node)
                     vmaxps_avx((undefined1  [16])local_2d98,(undefined1  [16])piVar5[-0x141]);
        local_2d88 = (intrusive_list_node)
                     vpaddq_avx((undefined1  [16])local_2d88,(undefined1  [16])piVar5[-0x140]);
        piVar5 = piVar5 + 5;
        puVar18 = (undefined1 *)((long)puVar18 + 0xffffffffffffffff);
      } while (puVar18 != (undefined1 *)0x0);
    }
  }
  pPVar1 = local_2de0;
  local_2d48 = (MemoryMonitorInterface *)&local_2dd0;
  local_2cc8.my_cpu_ctl_env = (uint64_t)this;
  local_2d18._0_8_ = &local_2cc8;
  createPrimRefArray_presplit<embree::avx::createPrimRefArray_presplit<embree::QuadMesh,embree::avx::QuadSplitterFactory>(embree::Scene*,embree::Geometry::GTypeMask,bool,unsigned_long,embree::vector_t<embree::PrimRef,embree::aligned_monitored_allocator<embree::PrimRef,32ul>>&,embree::BuildProgressMonitor&)::_lambda(embree::PrimRef_const&,unsigned_int,embree::avx::SplittingGrid_const&,embree::PrimRef*,unsigned_int&)_1_,embree::avx::createPrimRefArray_presplit<embree::QuadMesh,embree::avx::QuadSplitterFactory>(embree::Scene*,embree::Geometry::GTypeMask,bool,unsigned_long,embree::vector_t<embree::PrimRef,embree::aligned_monitored_allocator<embree::PrimRef,32ul>>&,embree::BuildProgressMonitor&)::_lambda(embree::PrimRef_const&)_1_,embree::vector_t<embree::PrimRef,embree::aligned_monitored_allocator<embree::PrimRef,32ul>>>
            (local_2de0,local_2df8,(size_t)local_2e00,
             (vector_t<embree::PrimRef,_embree::aligned_monitored_allocator<embree::PrimRef,_32UL>_>
              *)local_2dc8,(PrimInfo *)&local_2d18.field_1,(anon_class_8_1_78f12065 *)&local_2d48,
             in_stack_ffffffffffffd1e8);
  return pPVar1;
}

Assistant:

PrimInfo createPrimRefArray_presplit(Scene* scene, Geometry::GTypeMask types, bool mblur, size_t numPrimRefs, mvector<PrimRef>& prims, BuildProgressMonitor& progressMonitor)
    {
      ParallelForForPrefixSumState<PrimInfo> pstate;
      Scene::Iterator2 iter(scene,types,mblur);

      /* first try */
      progressMonitor(0);
      pstate.init(iter,size_t(1024));
      PrimInfo pinfo = parallel_for_for_prefix_sum0( pstate, iter, PrimInfo(empty), [&](Geometry* mesh, const range<size_t>& r, size_t k, size_t geomID) -> PrimInfo {
	  return mesh->createPrimRefArray(prims,r,k,(unsigned)geomID);
	}, [](const PrimInfo& a, const PrimInfo& b) -> PrimInfo { return PrimInfo::merge(a,b); });
      
      /* if we need to filter out geometry, run again */
      if (pinfo.size() != numPrimRefs)
	{
	  progressMonitor(0);
	  pinfo = parallel_for_for_prefix_sum1( pstate, iter, PrimInfo(empty), [&](Geometry* mesh, const range<size_t>& r, size_t k, size_t geomID, const PrimInfo& base) -> PrimInfo {
	      return mesh->createPrimRefArray(prims,r,base.size(),(unsigned)geomID);
	    }, [](const PrimInfo& a, const PrimInfo& b) -> PrimInfo { return PrimInfo::merge(a,b); });
	}


      SplitterFactory Splitter(scene);
        
      auto split_primitive = [&] (const PrimRef &prim,
                                  const unsigned int splitprims,
                                  const SplittingGrid& grid,
                                  PrimRef subPrims[MAX_PRESPLITS_PER_PRIMITIVE],
                                  unsigned int& numSubPrims)
      {
         const auto splitter = Splitter(prim);
         splitPrimitive(splitter,prim,splitprims,grid,subPrims,numSubPrims);
      };
      
      auto primitiveArea = [&] (const PrimRef &ref) {
        const unsigned int geomID = ref.geomID();
        const unsigned int primID = ref.primID();
        return ((Mesh*)scene->get(geomID))->projectedPrimitiveArea(primID);
      };
      
      return createPrimRefArray_presplit(numPrimRefs,prims,pinfo,split_primitive,primitiveArea);
    }